

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O2

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint32 flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  void *pvVar8;
  void *pvVar9;
  byte bVar10;
  ushort uVar11;
  mz_bool mVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  mz_zip_internal_state *pmVar18;
  mz_zip_internal_state *pmVar19;
  bool bVar20;
  uint uVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int *piVar26;
  mz_uint32 t;
  int iVar27;
  uint uVar28;
  size_t sVar29;
  mz_uint64 mVar30;
  ulong uVar31;
  mz_uint32 buf_u32 [1024];
  
  uVar17 = pZip->m_archive_size;
  if (uVar17 < 0x16) {
    return 0;
  }
  mVar30 = uVar17 - 0x1000;
  if ((long)uVar17 < 0x1001) {
    mVar30 = 0;
  }
LAB_00132452:
  sVar29 = uVar17 - mVar30;
  if (0xfff < sVar29) {
    sVar29 = 0x1000;
  }
  sVar16 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar30,buf_u32,sVar29);
  if (sVar16 != sVar29) {
    return 0;
  }
  uVar28 = (int)sVar29 - 4;
  do {
    if ((int)uVar28 < 0) goto LAB_0013248d;
    uVar17 = (ulong)uVar28;
    uVar28 = uVar28 - 1;
  } while (*(int *)((long)buf_u32 + uVar17) != 0x6054b50);
  sVar29 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar30 + uVar17,buf_u32,0x16);
  if (sVar29 != 0x16) {
    return 0;
  }
  if (buf_u32[0] != 0x6054b50) {
    return 0;
  }
  uVar28 = (uint)buf_u32[2]._2_2_;
  pZip->m_total_files = (uint)buf_u32[2]._2_2_;
  if (buf_u32[2]._2_2_ != (ushort)buf_u32[2]) {
    return 0;
  }
  if ((buf_u32[1]._2_2_ != 0 || (short)buf_u32[1] != 0) &&
     (buf_u32[1]._2_2_ != 1 || (short)buf_u32[1] != 1)) {
    return 0;
  }
  uVar17 = (ulong)buf_u32[3];
  if (buf_u32[3] < (uint)buf_u32[2]._2_2_ * 0x2e) {
    return 0;
  }
  uVar24 = (ulong)buf_u32[4];
  if (pZip->m_archive_size < uVar24 + uVar17) {
    return 0;
  }
  pZip->m_central_directory_file_ofs = uVar24;
  if (buf_u32[2]._2_2_ == 0) {
    uVar24 = 0;
  }
  else {
    pmVar19 = pZip->m_pState;
    pmVar18 = pmVar19;
    if ((pmVar19->m_central_dir).m_capacity < uVar17) {
      mVar12 = mz_zip_array_ensure_capacity(pZip,&pmVar19->m_central_dir,uVar17,0);
      if (mVar12 == 0) {
        return 0;
      }
      pmVar18 = pZip->m_pState;
      uVar28 = pZip->m_total_files;
    }
    (pmVar19->m_central_dir).m_size = uVar17;
    uVar23 = (ulong)uVar28;
    pmVar19 = pmVar18;
    if ((pmVar18->m_central_dir_offsets).m_capacity < uVar23) {
      mVar12 = mz_zip_array_ensure_capacity(pZip,&pmVar18->m_central_dir_offsets,uVar23,0);
      if (mVar12 == 0) {
        return 0;
      }
      pmVar19 = pZip->m_pState;
    }
    (pmVar18->m_central_dir_offsets).m_size = uVar23;
    pmVar18 = pmVar19;
    if ((flags >> 0xb & 1) == 0) {
      uVar23 = (ulong)pZip->m_total_files;
      if ((pmVar19->m_sorted_central_dir_offsets).m_capacity < uVar23) {
        mVar12 = mz_zip_array_ensure_capacity(pZip,&pmVar19->m_sorted_central_dir_offsets,uVar23,0);
        if (mVar12 == 0) {
          return 0;
        }
        pmVar18 = pZip->m_pState;
      }
      (pmVar19->m_sorted_central_dir_offsets).m_size = uVar23;
    }
    sVar29 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar24,(pmVar18->m_central_dir).m_p,uVar17);
    if (sVar29 != uVar17) {
      return 0;
    }
    pmVar19 = pZip->m_pState;
    piVar6 = (int *)(pmVar19->m_central_dir).m_p;
    piVar26 = piVar6;
    for (uVar23 = 0; uVar24 = (ulong)pZip->m_total_files, uVar23 < uVar24; uVar23 = uVar23 + 1) {
      uVar28 = (uint)uVar17;
      if (uVar28 < 0x2e) {
        return 0;
      }
      if (*piVar26 != 0x2014b50) {
        return 0;
      }
      *(int *)((long)(pmVar19->m_central_dir_offsets).m_p + uVar23 * 4) = (int)piVar26 - (int)piVar6
      ;
      if ((flags >> 0xb & 1) == 0) {
        *(int *)((long)(pmVar19->m_sorted_central_dir_offsets).m_p + uVar23 * 4) = (int)uVar23;
      }
      uVar21 = piVar26[5];
      uVar5 = piVar26[6];
      if (uVar5 != uVar21 && *(int *)((long)piVar26 + 10) == 0) {
        return 0;
      }
      if (uVar5 == 0xffffffff) {
        return 0;
      }
      if (uVar5 != 0 && uVar21 == 0) {
        return 0;
      }
      if (uVar21 == 0xffffffff) {
        return 0;
      }
      if (*(short *)((long)piVar26 + 0x22) != (short)buf_u32[1] &&
          *(short *)((long)piVar26 + 0x22) != 1) {
        return 0;
      }
      if (pZip->m_archive_size < (ulong)uVar21 + (ulong)*(uint *)((long)piVar26 + 0x2a) + 0x1e) {
        return 0;
      }
      uVar21 = (uint)*(ushort *)(piVar26 + 8) +
               (uint)*(ushort *)((long)piVar26 + 0x1e) + (uint)*(ushort *)(piVar26 + 7) + 0x2e;
      uVar17 = (ulong)(uVar28 - uVar21);
      if (uVar28 < uVar21) {
        return 0;
      }
      piVar26 = (int *)((long)piVar26 + (ulong)uVar21);
    }
  }
  if ((flags >> 0xb & 1) == 0) {
    pmVar19 = pZip->m_pState;
    puVar7 = (uint *)(pmVar19->m_sorted_central_dir_offsets).m_p;
    iVar25 = (int)uVar24;
    for (iVar13 = iVar25 + -2 >> 1; iVar15 = iVar13, -1 < iVar13; iVar13 = iVar13 + -1) {
      while (iVar27 = iVar15 * 2 + 1, iVar27 < iVar25) {
        iVar14 = iVar15 * 2 + 2;
        uVar28 = 0;
        pvVar8 = (pmVar19->m_central_dir).m_p;
        pvVar9 = (pmVar19->m_central_dir_offsets).m_p;
        if (iVar14 < iVar25) {
          uVar23 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[iVar27] * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[iVar14] * 4);
          uVar3 = *(ushort *)((long)pvVar8 + uVar23 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
          uVar11 = uVar4;
          if (uVar3 < uVar4) {
            uVar11 = uVar3;
          }
          bVar10 = 0;
          for (uVar31 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar31 + uVar23 + 0x2e), bVar22 = bVar10
              , pbVar1 < (byte *)((long)pvVar8 + uVar11 + uVar23 + 0x2e); uVar31 = uVar31 + 1) {
            bVar22 = *pbVar1;
            bVar10 = bVar22 + 0x20;
            if (0x19 < (byte)(bVar22 + 0xbf)) {
              bVar10 = bVar22;
            }
            bVar2 = *(byte *)((long)pvVar8 + uVar31 + uVar17 + 0x2e);
            bVar22 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar22 = bVar2;
            }
            if (bVar10 != bVar22) break;
          }
          bVar20 = bVar10 < bVar22;
          if (uVar11 == uVar31) {
            bVar20 = uVar3 < uVar4;
          }
          uVar28 = (uint)bVar20;
        }
        iVar27 = uVar28 + iVar27;
        uVar28 = puVar7[iVar15];
        uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)uVar28 * 4);
        uVar23 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[iVar27] * 4);
        uVar3 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar8 + uVar23 + 0x1c);
        uVar11 = uVar4;
        if (uVar3 < uVar4) {
          uVar11 = uVar3;
        }
        bVar10 = 0;
        for (uVar31 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar31 + uVar17 + 0x2e), bVar22 = bVar10,
            pbVar1 < (byte *)((long)pvVar8 + uVar11 + uVar17 + 0x2e); uVar31 = uVar31 + 1) {
          bVar22 = *pbVar1;
          bVar10 = bVar22 + 0x20;
          if (0x19 < (byte)(bVar22 + 0xbf)) {
            bVar10 = bVar22;
          }
          bVar2 = *(byte *)((long)pvVar8 + uVar31 + uVar23 + 0x2e);
          bVar22 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar22 = bVar2;
          }
          if (bVar10 != bVar22) break;
        }
        bVar20 = bVar22 <= bVar10;
        if (uVar11 == uVar31) {
          bVar20 = uVar4 <= uVar3;
        }
        if (bVar20) break;
        puVar7[iVar15] = puVar7[iVar27];
        puVar7[iVar27] = uVar28;
        iVar15 = iVar27;
      }
    }
LAB_001328f8:
    if (1 < (int)uVar24) {
      uVar24 = uVar24 - 1;
      uVar28 = puVar7[uVar24 & 0xffffffff];
      puVar7[uVar24 & 0xffffffff] = *puVar7;
      *puVar7 = uVar28;
      iVar25 = 0;
      while( true ) {
        iVar13 = iVar25 * 2 + 1;
        if ((int)uVar24 <= iVar13) break;
        iVar15 = iVar25 * 2 + 2;
        uVar21 = 0;
        pvVar8 = (pmVar19->m_central_dir).m_p;
        pvVar9 = (pmVar19->m_central_dir_offsets).m_p;
        if (iVar15 < (int)uVar24) {
          uVar23 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[iVar13] * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[iVar15] * 4);
          uVar3 = *(ushort *)((long)pvVar8 + uVar23 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
          uVar11 = uVar4;
          if (uVar3 < uVar4) {
            uVar11 = uVar3;
          }
          bVar10 = 0;
          for (uVar31 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar31 + uVar23 + 0x2e), bVar22 = bVar10
              , pbVar1 < (byte *)((long)pvVar8 + uVar11 + uVar23 + 0x2e); uVar31 = uVar31 + 1) {
            bVar22 = *pbVar1;
            bVar10 = bVar22 + 0x20;
            if (0x19 < (byte)(bVar22 + 0xbf)) {
              bVar10 = bVar22;
            }
            bVar2 = *(byte *)((long)pvVar8 + uVar31 + uVar17 + 0x2e);
            bVar22 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar22 = bVar2;
            }
            if (bVar10 != bVar22) break;
          }
          bVar20 = bVar10 < bVar22;
          if (uVar11 == uVar31) {
            bVar20 = uVar3 < uVar4;
          }
          uVar21 = (uint)bVar20;
        }
        iVar13 = uVar21 + iVar13;
        uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)uVar28 * 4);
        uVar23 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[iVar13] * 4);
        uVar3 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar8 + uVar23 + 0x1c);
        uVar11 = uVar4;
        if (uVar3 < uVar4) {
          uVar11 = uVar3;
        }
        bVar10 = 0;
        for (uVar31 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar31 + uVar17 + 0x2e), bVar22 = bVar10,
            pbVar1 < (byte *)((long)pvVar8 + uVar11 + uVar17 + 0x2e); uVar31 = uVar31 + 1) {
          bVar22 = *pbVar1;
          bVar10 = bVar22 + 0x20;
          if (0x19 < (byte)(bVar22 + 0xbf)) {
            bVar10 = bVar22;
          }
          bVar2 = *(byte *)((long)pvVar8 + uVar31 + uVar23 + 0x2e);
          bVar22 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar22 = bVar2;
          }
          if (bVar10 != bVar22) break;
        }
        bVar20 = bVar22 <= bVar10;
        if (uVar11 == uVar31) {
          bVar20 = uVar4 <= uVar3;
        }
        if (bVar20) break;
        puVar7[iVar25] = puVar7[iVar13];
        puVar7[iVar13] = uVar28;
        iVar25 = iVar13;
      }
      goto LAB_001328f8;
    }
  }
  return 1;
LAB_0013248d:
  if (mVar30 == 0) {
    return 0;
  }
  uVar17 = pZip->m_archive_size;
  uVar24 = uVar17 - mVar30;
  mVar30 = mVar30 - 0xffd;
  if (0x10014 < uVar24) {
    return 0;
  }
  goto LAB_00132452;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
					const mz_uint8 *pExtra_data;
					void* buf = NULL;

					if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size > n)
					{
						buf = MZ_MALLOC(ext_data_size);
						if(buf==NULL)
							return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

						if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size, buf, ext_data_size) != ext_data_size)
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
						}

						pExtra_data = (mz_uint8*)buf;
					}
					else
					{
						pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
					}

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

						if (extra_size_remaining < (sizeof(mz_uint16) * 2))
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
						}

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

						if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
						}

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);

					MZ_FREE(buf);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}